

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

void opengv::absolute_pose::Jac
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,Matrix3d *Jac)

{
  double dVar1;
  CoeffReturnType pdVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0> *this;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  Index in_stack_fffffffffffffed8;
  double row;
  DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0> *in_stack_fffffffffffffee0;
  
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0x7203dd);
  row = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (in_stack_fffffffffffffee0,(Index)row,0x7203fc);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = row;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pdVar2 * 4.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar5,auVar29);
  this = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720434);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = this;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pdVar2;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar6,auVar30);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720467);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar5._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4010000000000000),auVar7,auVar31);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720498);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar5._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar8,auVar32);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x7204c9);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7204ea);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x72050a);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar9,auVar33);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720545);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar5._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar10,auVar34);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x720578);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720599);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7205b9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar11,auVar35);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x7205f4);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar5._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar12,auVar36);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x720627);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720648);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720668);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar13,auVar37);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x7206a3);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar5._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar14,auVar38);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x7206d6);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7206f5);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720715);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *pdVar2 * 4.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar15,auVar39);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x72074e);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar5._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pdVar2;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar16,auVar40);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720784);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar5._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4010000000000000),auVar17,auVar41);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x7207bb);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar5._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar18,auVar42);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x7207f3);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720817);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x72083a);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar19,auVar43);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x72087b);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = auVar5._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar20,auVar44);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x7208b5);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7208d9);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7208fc);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar21,auVar45);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x72093d);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar5._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar22,auVar46);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x720976);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x72099a);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x7209bd);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *pdVar2 * 2.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar23,auVar47);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x7209fe);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = auVar5._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar24,auVar48);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x720a38);
  *pSVar4 = auVar5._0_8_;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720a5a);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720a7d);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar2 * 4.0;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar25,auVar49);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>::operator()
                     (this,(Index)row,0x720abc);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pdVar2;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar26,auVar50);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720af5);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar5._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x4010000000000000),auVar27,auVar51);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>,_0> *)this,(Index)row,
                      0x720b2c);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar5._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pdVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0xc010000000000000),auVar28,auVar52);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this,(Index)row,
                      0x720b64);
  *pSVar4 = auVar5._0_8_;
  return;
}

Assistant:

void Jac(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    Eigen::Matrix3d & Jac )
{
  Jac(0,0) = (2*M(4,4)+4*M(0,1)-4*M(0,0)+4*C(0,1)-4*C(0,0));
  Jac(0,1) = (2*M(5,4)+2*M(0,7)+2*C(0,7));
  Jac(0,2) = (2*M(6,4)+2*M(0,8)+2*C(0,8));
  Jac(1,0) = (2*M(4,5)+2*M(0,7)+2*C(0,7));
  Jac(1,1) = (2*M(5,5)+4*M(0,2)-4*M(0,0)+4*C(0,2)-4*C(0,0));
  Jac(1,2) = (2*M(6,5)+2*M(0,9)+2*C(0,9));
  Jac(2,0) = (2*M(4,6)+2*M(0,8)+2*C(0,8));
  Jac(2,1) = (2*M(5,6)+2*M(0,9)+2*C(0,9));
  Jac(2,2) = (2*M(6,6)+4*M(0,3)-4*M(0,0)+4*C(0,3)-4*C(0,0));
}